

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sparse_array.cpp
# Opt level: O3

void __thiscall
SparseArray_IteratorInitialization_Test<unsigned_int>::~SparseArray_IteratorInitialization_Test
          (SparseArray_IteratorInitialization_Test<unsigned_int> *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TYPED_TEST (SparseArray, IteratorInitialization) {
    std::array<std::size_t, 3> i1{{0, 2, 4}};
    std::array<int, 3> v1{{1, 2, 3}};

    auto arrp = sparse_array<int, TypeParam>::make_unique (std::begin (i1), std::end (i1),
                                                           std::begin (v1), std::end (v1));
    auto & arr = *arrp;

    EXPECT_EQ (arr[0], 1);
    EXPECT_FALSE (arr.has_index (1));
    EXPECT_EQ (arr[2], 2);
    EXPECT_FALSE (arr.has_index (3));
    EXPECT_EQ (arr[4], 3);
}